

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.cpp
# Opt level: O2

void Diligent::ValidateRenderPassDesc
               (RenderPassDesc *Desc,RenderDeviceInfo *DeviceInfo,GraphicsAdapterInfo *AdapterInfo)

{
  Uint32 *pUVar1;
  RESOURCE_STATE RVar2;
  char *pcVar3;
  AttachmentReference *pAVar4;
  SubpassDependencyDesc *pSVar5;
  SubpassDesc *pSVar6;
  byte bVar7;
  RESOURCE_STATE RVar8;
  uint uVar9;
  uint uVar10;
  TextureFormatAttribs *pTVar11;
  ulong uVar12;
  GraphicsAdapterInfo *pGVar13;
  TextureFormatAttribs *Args_12;
  SubpassDesc *pSVar14;
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE extraout_EDX_00;
  GraphicsAdapterInfo *extraout_RDX;
  GraphicsAdapterInfo *extraout_RDX_00;
  GraphicsAdapterInfo *extraout_RDX_01;
  GraphicsAdapterInfo *extraout_RDX_02;
  GraphicsAdapterInfo *extraout_RDX_03;
  GraphicsAdapterInfo *extraout_RDX_04;
  GraphicsAdapterInfo *extraout_RDX_05;
  GraphicsAdapterInfo *extraout_RDX_06;
  GraphicsAdapterInfo *extraout_RDX_07;
  GraphicsAdapterInfo *extraout_RDX_08;
  GraphicsAdapterInfo *extraout_RDX_09;
  GraphicsAdapterInfo *extraout_RDX_10;
  GraphicsAdapterInfo *extraout_RDX_11;
  GraphicsAdapterInfo *extraout_RDX_12;
  GraphicsAdapterInfo *extraout_RDX_13;
  GraphicsAdapterInfo *extraout_RDX_14;
  GraphicsAdapterInfo *extraout_RDX_15;
  GraphicsAdapterInfo *extraout_RDX_16;
  GraphicsAdapterInfo *extraout_RDX_17;
  GraphicsAdapterInfo *extraout_RDX_18;
  GraphicsAdapterInfo *extraout_RDX_19;
  GraphicsAdapterInfo *extraout_RDX_20;
  GraphicsAdapterInfo *extraout_RDX_21;
  GraphicsAdapterInfo *extraout_RDX_22;
  GraphicsAdapterInfo *extraout_RDX_23;
  GraphicsAdapterInfo *extraout_RDX_24;
  GraphicsAdapterInfo *extraout_RDX_25;
  GraphicsAdapterInfo *extraout_RDX_26;
  GraphicsAdapterInfo *extraout_RDX_27;
  GraphicsAdapterInfo *extraout_RDX_28;
  GraphicsAdapterInfo *extraout_RDX_29;
  AttachmentReference *Args_4;
  Diligent *this;
  ShadingRateAttachment *this_00;
  AttachmentReference *AttchRef;
  RenderPassAttachmentDesc *pRVar15;
  Uint32 *Args_6;
  ShadingRateAttachment *pSVar16;
  bool bVar17;
  uint local_dc;
  char *local_d8;
  string msg;
  Uint32 PrsvAttachment;
  undefined4 uStack_ac;
  RENDER_DEVICE_TYPE local_a4;
  Uint32 *local_a0;
  uint local_94;
  ShadingRateAttachment *local_90;
  GraphicsAdapterInfo *local_88;
  Uint32 *local_80;
  Uint32 *local_78;
  Uint32 *local_70;
  Uint32 *local_68;
  Uint32 *local_60;
  Uint32 *local_58;
  char *local_50;
  RenderDeviceInfo *local_48;
  char *local_40;
  char *local_38;
  
  local_a4 = DeviceInfo->Type;
  local_a0 = &Desc->AttachmentCount;
  local_88 = AdapterInfo;
  local_48 = DeviceInfo;
  if ((Desc->AttachmentCount != 0) && (Desc->pAttachments == (RenderPassAttachmentDesc *)0x0)) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x33,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [23])0x661d89,local_a0,
               (char (*) [41])") is not zero, but pAttachments is null.");
    AdapterInfo = extraout_RDX;
  }
  if (Desc->SubpassCount == 0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[44]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x3a,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [44])"render pass must have at least one subpass.");
    AdapterInfo = extraout_RDX_00;
  }
  if (Desc->pSubpasses == (SubpassDesc *)0x0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[29]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x40,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [29])"pSubpasses must not be null.");
    AdapterInfo = extraout_RDX_01;
  }
  local_60 = &Desc->DependencyCount;
  if ((Desc->DependencyCount != 0) && (Desc->pDependencies == (SubpassDependencyDesc *)0x0)) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[42]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x48,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [23])"the dependency count (",local_60,
               (char (*) [42])") is not zero, but pDependencies is null.");
    AdapterInfo = extraout_RDX_02;
  }
  RVar8 = RESOURCE_STATE_UNKNOWN;
  do {
    _PrsvAttachment = (char *)CONCAT44(uStack_ac,RVar8);
    if (*local_a0 <= RVar8) {
      bVar17 = local_a4 == RENDER_DEVICE_TYPE_VULKAN;
      local_38 = "INPUT_ATTACHMENT";
      if (bVar17) {
        local_38 = "INPUT_ATTACHMENT or COMMON";
      }
      local_40 = "RENDER_TARGET";
      if (bVar17) {
        local_40 = "RENDER_TARGET or COMMON";
      }
      local_50 = "DEPTH_READ or DEPTH_WRITE";
      if (bVar17) {
        local_50 = "DEPTH_READ, DEPTH_WRITE or COMMON";
      }
      local_68 = (local_88->ShadingRate).MinTileSize;
      local_78 = (local_88->ShadingRate).MaxTileSize;
      local_70 = (local_88->ShadingRate).MinTileSize + 1;
      local_80 = (local_88->ShadingRate).MaxTileSize + 1;
      uVar12 = 0;
      local_90 = (ShadingRateAttachment *)0x0;
      do {
        local_dc = (uint)uVar12;
        uVar9 = Desc->SubpassCount;
        if (uVar9 <= local_dc) {
          if ((local_90 != (ShadingRateAttachment *)0x0) &&
             (((local_88->ShadingRate).CapFlags &
              SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS) != SHADING_RATE_CAP_FLAG_NONE
             )) {
            uVar10 = 0;
            pSVar16 = local_90;
            while( true ) {
              local_d8 = (char *)CONCAT44(local_d8._4_4_,uVar10);
              if (uVar9 <= uVar10) break;
              pSVar14 = Desc->pSubpasses;
              this_00 = pSVar14[uVar10].pShadingRateAttachment;
              if (this_00 == (ShadingRateAttachment *)0x0) {
                pSVar6 = pSVar14 + uVar10;
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                pSVar14 = (SubpassDesc *)0x1a3;
                LogError<true,char[29],char_const*,char[15],char[57],unsigned_int,char[198]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x1a3,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [57])"render pass uses a shading rate attachment, but subpass "
                           ,(uint *)&local_d8,
                           (char (*) [198])
                           " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                          );
                this_00 = pSVar6->pShadingRateAttachment;
                pSVar16 = local_90;
              }
              bVar17 = ShadingRateAttachment::operator!=(this_00,pSVar16);
              if (bVar17) {
                if ((uint)local_d8 == 0) {
                  FormatString<char[26],char[12]>
                            (&msg,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"subpass > 0",(char (*) [12])pSVar14);
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"ValidateRenderPassDesc",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                             ,0x1a8);
                  std::__cxx11::string::~string((string *)&msg);
                }
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[36],unsigned_int,char[236]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x1ac,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [36])0x666874,
                           (uint *)&local_d8,
                           (char (*) [236])
                           " does not match the shading rate attachment used by previous subpasses. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                          );
              }
              uVar10 = (uint)local_d8 + 1;
              uVar9 = Desc->SubpassCount;
            }
          }
          uVar9 = 0;
          while( true ) {
            local_d8 = (char *)CONCAT44(local_d8._4_4_,uVar9);
            if (*local_60 <= uVar9) break;
            pSVar5 = Desc->pDependencies;
            if (pSVar5[uVar9].SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[15]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x1b7,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [45])"the source stage mask of subpass dependency ",
                         (uint *)&local_d8,(char (*) [15])0x667418);
            }
            if (pSVar5[uVar9].DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[50],unsigned_int,char[15]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x1bb,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [50])"the destination stage mask of subpass dependency ",
                         (uint *)&local_d8,(char (*) [15])0x667418);
            }
            uVar9 = (uint)local_d8 + 1;
          }
          return;
        }
        pSVar14 = Desc->pSubpasses + uVar12;
        if ((Desc->pSubpasses[uVar12].InputAttachmentCount != 0) &&
           (pSVar14->pInputAttachments == (AttachmentReference *)0x0)) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[14],unsigned_int,char[47]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xa2,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [29])"the input attachment count (",
                     &pSVar14->InputAttachmentCount,(char (*) [14])") of subpass ",&local_dc,
                     (char (*) [47])" is not zero, while pInputAttachments is null.");
          AdapterInfo = extraout_RDX_07;
        }
        pUVar1 = &pSVar14->RenderTargetAttachmentCount;
        if ((pSVar14->RenderTargetAttachmentCount != 0) &&
           (pSVar14->pRenderTargetAttachments == (AttachmentReference *)0x0)) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[14],unsigned_int,char[54]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xa7,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",
                     (char (*) [37])"the render target attachment count (",pUVar1,
                     (char (*) [14])") of subpass ",&local_dc,
                     (char (*) [54])" is not zero, while pRenderTargetAttachments is null.");
          AdapterInfo = extraout_RDX_08;
        }
        local_58 = &pSVar14->PreserveAttachmentCount;
        if ((pSVar14->PreserveAttachmentCount != 0) &&
           (pSVar14->pPreserveAttachments == (Uint32 *)0x0)) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[14],unsigned_int,char[50]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xac,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",
                     (char (*) [32])"the preserve attachment count (",local_58,
                     (char (*) [14])") of subpass ",&local_dc,
                     (char (*) [50])" is not zero, while pPreserveAttachments is null.");
          AdapterInfo = extraout_RDX_09;
        }
        for (local_94 = 0; local_94 < pSVar14->InputAttachmentCount; local_94 = local_94 + 1) {
          RVar8 = pSVar14->pInputAttachments[local_94].AttachmentIndex;
          AdapterInfo = (GraphicsAdapterInfo *)(ulong)RVar8;
          if (RVar8 != ~RESOURCE_STATE_UNKNOWN) {
            pAVar4 = pSVar14->pInputAttachments + local_94;
            if (*local_a0 <= RVar8) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[33],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xbc,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pAVar4->AttachmentIndex,(char (*) [33])") of input attachment reference ",
                         &local_94,(char (*) [13])0x6661d1,&local_dc,
                         (char (*) [47])" must be less than the number of attachments (",local_a0,
                         (char (*) [3])0x668694);
              AdapterInfo = extraout_RDX_10;
            }
            RVar8 = pAVar4->State;
            if ((RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT) &&
               (RVar8 != RESOURCE_STATE_COMMON || local_a4 != RENDER_DEVICE_TYPE_VULKAN)) {
              local_d8 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d8 == (char *)0x0) {
                local_d8 = "";
              }
              _PrsvAttachment = local_38;
              GetResourceStateString_abi_cxx11_
                        (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[44],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xc3,(char (*) [29])"Description of render pass \'",&local_d8,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar4->AttachmentIndex,
                         (char (*) [44])" referenced as input attachment in subpass ",&local_dc,
                         (char (*) [13])" must be in ",(char **)&PrsvAttachment,
                         (char (*) [32])0x6668b0,&msg);
              std::__cxx11::string::~string((string *)&msg);
              AdapterInfo = extraout_RDX_11;
            }
          }
        }
        uVar12 = 0;
        while (local_94 = (uint)uVar12, local_94 < *pUVar1) {
          RVar8 = pSVar14->pRenderTargetAttachments[uVar12].AttachmentIndex;
          AdapterInfo = (GraphicsAdapterInfo *)(ulong)RVar8;
          if (RVar8 != ~RESOURCE_STATE_UNKNOWN) {
            pAVar4 = pSVar14->pRenderTargetAttachments + uVar12;
            if (*local_a0 <= RVar8) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xd4,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pAVar4->AttachmentIndex,
                         (char (*) [41])") of render target attachment reference ",&local_94,
                         (char (*) [13])0x6661d1,&local_dc,
                         (char (*) [47])" must be less than the number of attachments (",local_a0,
                         (char (*) [3])0x668694);
              RVar8 = extraout_EDX;
            }
            RVar2 = pAVar4->State;
            if ((RVar2 != RESOURCE_STATE_RENDER_TARGET) &&
               (RVar2 != RESOURCE_STATE_COMMON || local_a4 != RENDER_DEVICE_TYPE_VULKAN)) {
              local_d8 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d8 == (char *)0x0) {
                local_d8 = "";
              }
              _PrsvAttachment = local_40;
              GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)RVar2,RVar8);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xdb,(char (*) [29])"Description of render pass \'",&local_d8,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar4->AttachmentIndex,
                         (char (*) [52])" referenced as render target attachment in subpass ",
                         &local_dc,(char (*) [13])" must be in ",(char **)&PrsvAttachment,
                         (char (*) [32])0x6668b0,&msg);
              std::__cxx11::string::~string((string *)&msg);
            }
            pTVar11 = GetTextureFormatAttribs(Desc->pAttachments[pAVar4->AttachmentIndex].Format);
            AdapterInfo = extraout_RDX_12;
            if ((pTVar11->ComponentType < 0xb) &&
               (AdapterInfo = (GraphicsAdapterInfo *)0x580,
               (0x580U >> (pTVar11->ComponentType & 0x1f) & 1) != 0)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[45]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xe5,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar4->AttachmentIndex,
                         (char (*) [52])" referenced as render target attachment in subpass ",
                         &local_dc,(char (*) [14])" uses format ",&pTVar11->Name,
                         (char (*) [45])", which is not a valid render target format.");
              AdapterInfo = extraout_RDX_13;
            }
          }
          uVar12 = (ulong)(local_94 + 1);
        }
        if (pSVar14->pResolveAttachments != (AttachmentReference *)0x0) {
          pGVar13 = (GraphicsAdapterInfo *)0x0;
          while( true ) {
            uVar9 = (uint)pGVar13;
            local_d8 = (char *)CONCAT44(local_d8._4_4_,uVar9);
            if (*pUVar1 <= uVar9) break;
            RVar8 = pSVar14->pResolveAttachments[(long)pGVar13].AttachmentIndex;
            AdapterInfo = pGVar13;
            if ((RVar8 != ~RESOURCE_STATE_UNKNOWN) && (*local_a0 <= RVar8)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[35],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xf8,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pSVar14->pResolveAttachments[(long)pGVar13].AttachmentIndex,
                         (char (*) [35])") of resolve attachment reference ",(uint *)&local_d8,
                         (char (*) [13])0x6661d1,&local_dc,
                         (char (*) [47])" must be less than the number of attachments (",local_a0,
                         (char (*) [3])0x668694);
              AdapterInfo = extraout_RDX_14;
              uVar9 = (uint)local_d8;
            }
            pGVar13 = (GraphicsAdapterInfo *)(ulong)(uVar9 + 1);
          }
        }
        RVar8 = (RESOURCE_STATE)AdapterInfo;
        pAVar4 = pSVar14->pDepthStencilAttachment;
        if ((pAVar4 != (AttachmentReference *)0x0) &&
           (pAVar4->AttachmentIndex != ~RESOURCE_STATE_UNKNOWN)) {
          if (*local_a0 <= pAVar4->AttachmentIndex) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[47],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x109,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       &pAVar4->AttachmentIndex,
                       (char (*) [52])") of depth-stencil attachment reference of subpass ",
                       &local_dc,(char (*) [47])" must be less than the number of attachments (",
                       local_a0,(char (*) [3])0x668694);
            RVar8 = extraout_EDX_00;
          }
          RVar2 = pAVar4->State;
          if (((RVar2 != RESOURCE_STATE_DEPTH_WRITE) && (RVar2 != RESOURCE_STATE_DEPTH_READ)) &&
             ((local_a4 != RENDER_DEVICE_TYPE_VULKAN || (RVar2 != RESOURCE_STATE_COMMON)))) {
            local_d8 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d8 == (char *)0x0) {
              local_d8 = "";
            }
            _PrsvAttachment = local_50;
            GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)RVar2,RVar8);
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x110,(char (*) [29])"Description of render pass \'",&local_d8,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                       &pAVar4->AttachmentIndex,
                       (char (*) [52])" referenced as depth stencil attachment in subpass ",
                       &local_dc,(char (*) [13])" must be in ",(char **)&PrsvAttachment,
                       (char (*) [32])0x6668b0,&msg);
            std::__cxx11::string::~string((string *)&msg);
          }
          pTVar11 = GetTextureFormatAttribs(Desc->pAttachments[pAVar4->AttachmentIndex].Format);
          AdapterInfo = extraout_RDX_15;
          if (1 < (byte)(pTVar11->ComponentType - COMPONENT_TYPE_DEPTH)) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[44]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x119,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                       &pAVar4->AttachmentIndex,
                       (char (*) [52])" referenced as depth-stencil attachment in subpass ",
                       &local_dc,(char (*) [14])" uses format ",&pTVar11->Name,
                       (char (*) [44])", which is not a valid depth buffer format.");
            AdapterInfo = extraout_RDX_16;
          }
        }
        uVar9 = 0;
        while( true ) {
          local_d8 = (char *)CONCAT44(local_d8._4_4_,uVar9);
          if (*local_58 <= uVar9) break;
          RVar8 = pSVar14->pPreserveAttachments[uVar9];
          _PrsvAttachment = (char *)CONCAT44(uStack_ac,RVar8);
          if (RVar8 == ~RESOURCE_STATE_UNKNOWN) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[55],unsigned_int,char[13],unsigned_int,char[23]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x126,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [55])"the attachment index of preserve attachment reference ",
                       (uint *)&local_d8,(char (*) [13])0x6661d1,&local_dc,(char (*) [23])0x666681);
            AdapterInfo = extraout_RDX_17;
            RVar8 = PrsvAttachment;
          }
          if (*local_a0 <= RVar8) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[36],unsigned_int,char[13],unsigned_int,char[37],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,300,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       &PrsvAttachment,(char (*) [36])") of preserve attachment reference ",
                       (uint *)&local_d8,(char (*) [13])0x6661d1,&local_dc,
                       (char (*) [37])" exceeds the number of attachments (",local_a0,
                       (char (*) [3])0x668694);
            AdapterInfo = extraout_RDX_18;
          }
          uVar9 = (uint)local_d8 + 1;
        }
        if (pSVar14->pResolveAttachments != (AttachmentReference *)0x0) {
          uVar9 = 0;
          while( true ) {
            local_d8 = (char *)CONCAT44(local_d8._4_4_,uVar9);
            if (*pUVar1 <= uVar9) break;
            Args_4 = pSVar14->pRenderTargetAttachments + uVar9;
            pAVar4 = pSVar14->pResolveAttachments + uVar9;
            uVar9 = pAVar4->AttachmentIndex;
            if (uVar9 != 0xffffffff) {
              uVar10 = Args_4->AttachmentIndex;
              if (uVar10 == 0xffffffff) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[47],unsigned_int,char[102]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x13c,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [32])"pResolveAttachments of subpass ",&local_dc,
                           (char (*) [47])" is not null and resolve attachment reference ",
                           (uint *)&local_d8,
                           (char (*) [102])
                           " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED."
                          );
                uVar9 = pAVar4->AttachmentIndex;
                AdapterInfo = extraout_RDX_19;
                if (uVar9 == 0xffffffff) goto LAB_00444055;
                uVar10 = Args_4->AttachmentIndex;
              }
              AdapterInfo = (GraphicsAdapterInfo *)Desc->pAttachments;
              if (AdapterInfo->Description[(ulong)uVar10 * 0x10 + 2] == '\x01') {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x146,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [35])"Render target attachment at index ",
                           &Args_4->AttachmentIndex,(char (*) [15])" referenced by",
                           (char (*) [23])0x66661b,(uint *)&local_d8,(char (*) [13])0x6661d1,
                           &local_dc,
                           (char (*) [72])
                           " is used as the source of resolve operation, but its sample count is 1."
                          );
                uVar9 = pAVar4->AttachmentIndex;
                AdapterInfo = extraout_RDX_20;
                if (uVar9 == 0xffffffff) goto LAB_00444055;
              }
              if (Desc->pAttachments[uVar9].SampleCount != '\x01') {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[30]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x150,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [29])"Resolve attachment at index ",&pAVar4->AttachmentIndex,
                           (char (*) [15])" referenced by",(char (*) [23])0x66661b,(uint *)&local_d8
                           ,(char (*) [13])0x6661d1,&local_dc,
                           (char (*) [30])" must have sample count of 1.");
                AdapterInfo = extraout_RDX_21;
              }
            }
LAB_00444055:
            if ((ulong)Args_4->AttachmentIndex != 0xffffffff) {
              AdapterInfo = (GraphicsAdapterInfo *)0xffffffff;
              if ((ulong)pAVar4->AttachmentIndex != 0xffffffff) {
                AdapterInfo = (GraphicsAdapterInfo *)Desc->pAttachments;
                if (*(TEXTURE_FORMAT *)
                     (AdapterInfo->Description + (ulong)Args_4->AttachmentIndex * 0x10) !=
                    *(TEXTURE_FORMAT *)
                     (AdapterInfo->Description + (ulong)pAVar4->AttachmentIndex * 0x10)) {
                  msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                  if (msg._M_dataplus._M_p == (char *)0x0) {
                    msg._M_dataplus._M_p = "";
                  }
                  pTVar11 = GetTextureFormatAttribs
                                      (*(TEXTURE_FORMAT *)
                                        (AdapterInfo->Description +
                                        (ulong)Args_4->AttachmentIndex * 0x10));
                  Args_12 = GetTextureFormatAttribs
                                      (Desc->pAttachments[pAVar4->AttachmentIndex].Format);
                  LogError<true,char[29],char_const*,char[15],char[13],char_const*,char[40],unsigned_int,char[37],unsigned_int,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
                            (false,"ValidateRenderPassDesc",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                             ,0x160,(char (*) [29])"Description of render pass \'",(char **)&msg,
                             (char (*) [15])"\' is invalid: ",(char (*) [13])"The format (",
                             &pTVar11->Name,(char (*) [40])") of render target attachment at index "
                             ,&Args_4->AttachmentIndex,
                             (char (*) [37])" referenced by attachment reference ",(uint *)&local_d8
                             ,(char (*) [13])0x6661d1,&local_dc,
                             (char (*) [29])" does not match the format (",&Args_12->Name,
                             (char (*) [52])") of the corresponding resolve attachment at index ",
                             &pAVar4->AttachmentIndex,(char (*) [2])0x665ed2);
                  AdapterInfo = extraout_RDX_22;
                }
              }
            }
            uVar9 = (uint)local_d8 + 1;
          }
        }
        pSVar16 = pSVar14->pShadingRateAttachment;
        if (pSVar16 != (ShadingRateAttachment *)0x0) {
          if (local_90 == (ShadingRateAttachment *)0x0) {
            local_90 = pSVar16;
          }
          RVar8 = (pSVar16->Attachment).AttachmentIndex;
          if (RVar8 != ~RESOURCE_STATE_UNKNOWN) {
            if (*local_a0 <= RVar8) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x16e,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         (uint *)pSVar16,
                         (char (*) [51])") of shading rate attachment reference of subpass ",
                         &local_dc,(char (*) [47])" must be less than the number of attachments (",
                         local_a0,(char (*) [3])0x668694);
              AdapterInfo = extraout_RDX_23;
            }
            if ((local_48->Features).VariableRateShading == DEVICE_FEATURE_STATE_DISABLED) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[87]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x172,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x6661d5,&local_dc,
                         (char (*) [87])
                         " uses a shading rate attachment, but VariableRateShading device feature is not enabled"
                        );
              AdapterInfo = extraout_RDX_24;
            }
            RVar8 = (pSVar16->Attachment).State;
            if (RVar8 != RESOURCE_STATE_MAX_BIT) {
              local_d8 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d8 == (char *)0x0) {
                local_d8 = "";
              }
              GetResourceStateString_abi_cxx11_
                        (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[56],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x177,(char (*) [29])"Description of render pass \'",&local_d8,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         (uint *)pSVar16,
                         (char (*) [51])" referenced as shading rate attachment in subpass ",
                         &local_dc,
                         (char (*) [56])" must be in SHADING_RATE state, but specified state is ",
                         &msg);
              std::__cxx11::string::~string((string *)&msg);
              AdapterInfo = extraout_RDX_25;
            }
            pSVar16 = pSVar14->pShadingRateAttachment;
            uVar9 = pSVar16->TileSize[0];
            if ((uVar9 != 0) || (pSVar16->TileSize[1] != 0)) {
              pUVar1 = pSVar16->TileSize;
              if ((uVar9 < *local_68) || (*local_78 < uVar9)) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x181,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [9])0x6661d5,&local_dc,
                           (char (*) [47])" uses shading rate attachment with tile width ",pUVar1,
                           (char (*) [36])" that is not in the allowed range [",local_68,
                           (char (*) [3])0x6bcb09,local_78,
                           (char (*) [67])
                           "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                AdapterInfo = extraout_RDX_26;
              }
              uVar9 = pSVar16->TileSize[1];
              Args_6 = pSVar16->TileSize + 1;
              if ((uVar9 < *local_70) || (*local_80 < uVar9)) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[48],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x187,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [9])0x6661d5,&local_dc,
                           (char (*) [48])" uses shading rate attachment with tile height ",Args_6,
                           (char (*) [36])" that is not in the allowed range [",local_70,
                           (char (*) [3])0x6bcb09,local_80,
                           (char (*) [67])
                           "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                uVar9 = *Args_6;
                AdapterInfo = extraout_RDX_27;
              }
              if (*pUVar1 != uVar9) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[39],unsigned_int,char[2]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x18d,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [9])0x6661d5,&local_dc,
                           (char (*) [47])" uses shading rate attachment with tile width ",pUVar1,
                           (char (*) [39])" that is not equal to the tile height ",Args_6,
                           (char (*) [2])0x665ed2);
                uVar9 = *pUVar1;
                AdapterInfo = extraout_RDX_28;
              }
              if (((uVar9 ^ uVar9 - 1) <= uVar9 - 1) ||
                 (uVar9 = *Args_6 - 1, (*Args_6 ^ uVar9) <= uVar9)) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                local_d8 = (char *)CONCAT71(local_d8._1_7_,0x78);
                LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char,unsigned_int,char[31]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x192,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [9])0x6661d5,&local_dc,
                           (char (*) [47])" uses shading rate attachment with tile sizes ",pUVar1,
                           (char *)&local_d8,Args_6,(char (*) [31])" that are not a powers of two.")
                ;
                AdapterInfo = extraout_RDX_29;
              }
            }
          }
        }
        uVar12 = (ulong)(local_dc + 1);
      } while( true );
    }
    pRVar15 = Desc->pAttachments;
    if (pRVar15[RVar8].Format == TEX_FORMAT_UNKNOWN) {
      msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      LogError<true,char[29],char_const*,char[15],char[26],unsigned_int,char[13]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x4f,(char (*) [29])"Description of render pass \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",(char (*) [26])"the format of attachment ",
                 &PrsvAttachment,(char (*) [13])" is unknown.");
    }
    pRVar15 = pRVar15 + RVar8;
    bVar7 = pRVar15->SampleCount;
    if (bVar7 == 0) {
      msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[10]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x52,(char (*) [29])"Description of render pass \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",(char (*) [32])"the sample count of attachment ",
                 &PrsvAttachment,(char (*) [10])0x663f1b);
      bVar7 = pRVar15->SampleCount;
      if (bVar7 != 0) goto LAB_00443081;
      bVar7 = 0;
LAB_0044308c:
      msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      local_d8 = (char *)CONCAT44(local_d8._4_4_,(uint)bVar7);
      LogError<true,char[29],char_const*,char[15],char[19],unsigned_int,char[17],unsigned_int,char[22]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x55,(char (*) [29])"Description of render pass \'",(char **)&msg,
                 (char (*) [15])"\' is invalid: ",(char (*) [19])0x661cd0,(uint *)&local_d8,
                 (char (*) [17])") of attachment ",&PrsvAttachment,
                 (char (*) [22])" is not power of two.");
    }
    else {
LAB_00443081:
      if ((bVar7 & bVar7 - 1) != 0) goto LAB_0044308c;
    }
    pTVar11 = GetTextureFormatAttribs(pRVar15->Format);
    RVar8 = pRVar15->InitialState;
    this = (Diligent *)(ulong)RVar8;
    AdapterInfo = extraout_RDX_03;
    if ((byte)(pTVar11->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
      if (((((0x3f < RVar8 - RESOURCE_STATE_UNDEFINED) ||
            ((0x8000000080000001U >> ((ulong)(RVar8 - RESOURCE_STATE_UNDEFINED) & 0x3f) & 1) == 0))
           && (RVar8 != RESOURCE_STATE_DEPTH_READ)) &&
          (((RVar8 != RESOURCE_STATE_SHADER_RESOURCE && (RVar8 != RESOURCE_STATE_COPY_DEST)) &&
           ((RVar8 != RESOURCE_STATE_COPY_SOURCE &&
            ((RVar8 != RESOURCE_STATE_RESOLVE_DEST && (RVar8 != RESOURCE_STATE_RESOLVE_SOURCE)))))))
          ) && ((RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT &&
                ((local_a4 != RENDER_DEVICE_TYPE_VULKAN || (RVar8 != RESOURCE_STATE_COMMON)))))) {
        local_d8 = (Desc->super_DeviceObjectAttribs).Name;
        if (local_d8 == (char *)0x0) {
          local_d8 = "";
        }
        GetResourceStateString_abi_cxx11_(&msg,this,(RESOURCE_STATE)extraout_RDX_03);
        LogError<true,char[29],char_const*,char[15],char[47],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x67,(char (*) [29])"Description of render pass \'",&local_d8,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [47])"the initial state of depth-stencil attachment ",&PrsvAttachment,
                   (char (*) [3])0x5bee10,&msg,(char (*) [14])") is invalid.");
        std::__cxx11::string::~string((string *)&msg);
        AdapterInfo = extraout_RDX_04;
      }
      RVar8 = pRVar15->FinalState;
      if ((((((RVar8 != RESOURCE_STATE_UNORDERED_ACCESS) && (RVar8 != RESOURCE_STATE_DEPTH_WRITE))
            && (RVar8 != RESOURCE_STATE_DEPTH_READ)) &&
           ((RVar8 != RESOURCE_STATE_SHADER_RESOURCE && (RVar8 != RESOURCE_STATE_COPY_DEST)))) &&
          (((RVar8 != RESOURCE_STATE_COPY_SOURCE &&
            ((RVar8 != RESOURCE_STATE_RESOLVE_DEST && (RVar8 != RESOURCE_STATE_RESOLVE_SOURCE)))) &&
           (RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT)))) &&
         ((local_a4 != RENDER_DEVICE_TYPE_VULKAN || (RVar8 != RESOURCE_STATE_COMMON)))) {
        local_d8 = (Desc->super_DeviceObjectAttribs).Name;
        if (local_d8 == (char *)0x0) {
          local_d8 = "";
        }
        GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo)
        ;
        LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x75,(char (*) [29])"Description of render pass \'",&local_d8,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [45])"the final state of depth-stencil attachment ",&PrsvAttachment,
                   (char (*) [3])0x5bee10,&msg,(char (*) [14])") is invalid.");
LAB_004434ea:
        std::__cxx11::string::~string((string *)&msg);
        AdapterInfo = extraout_RDX_06;
      }
    }
    else {
      if ((((((RESOURCE_STATE_UNORDERED_ACCESS < RVar8) ||
             ((0x100010002U >> ((ulong)this & 0x3f) & 1) == 0)) &&
            (RVar8 != RESOURCE_STATE_SHADER_RESOURCE)) &&
           ((RVar8 != RESOURCE_STATE_COPY_DEST && (RVar8 != RESOURCE_STATE_COPY_SOURCE)))) &&
          ((RVar8 != RESOURCE_STATE_RESOLVE_DEST &&
           ((RVar8 != RESOURCE_STATE_RESOLVE_SOURCE && (RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT))))
          )) && ((RVar8 != RESOURCE_STATE_PRESENT &&
                 ((RVar8 != RESOURCE_STATE_MAX_BIT &&
                  ((local_a4 != RENDER_DEVICE_TYPE_VULKAN || (RVar8 != RESOURCE_STATE_COMMON))))))))
      {
        local_d8 = (Desc->super_DeviceObjectAttribs).Name;
        if (local_d8 == (char *)0x0) {
          local_d8 = "";
        }
        GetResourceStateString_abi_cxx11_(&msg,this,(RESOURCE_STATE)extraout_RDX_03);
        LogError<true,char[29],char_const*,char[15],char[39],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x87,(char (*) [29])"Description of render pass \'",&local_d8,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [39])"the initial state of color attachment ",&PrsvAttachment,
                   (char (*) [3])0x5bee10,&msg,(char (*) [14])") is invalid.");
        std::__cxx11::string::~string((string *)&msg);
        AdapterInfo = extraout_RDX_05;
      }
      RVar8 = pRVar15->FinalState;
      if (((((RVar8 != RESOURCE_STATE_RENDER_TARGET) && (RVar8 != RESOURCE_STATE_UNORDERED_ACCESS))
           && (RVar8 != RESOURCE_STATE_SHADER_RESOURCE)) &&
          (((RVar8 != RESOURCE_STATE_COPY_DEST && (RVar8 != RESOURCE_STATE_COPY_SOURCE)) &&
           ((RVar8 != RESOURCE_STATE_RESOLVE_DEST &&
            ((RVar8 != RESOURCE_STATE_RESOLVE_SOURCE && (RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT)))
            ))))) && (RVar8 != RESOURCE_STATE_PRESENT)) {
        if ((RVar8 != RESOURCE_STATE_MAX_BIT) &&
           (RVar8 != RESOURCE_STATE_COMMON || local_a4 != RENDER_DEVICE_TYPE_VULKAN)) {
          local_d8 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_d8 == (char *)0x0) {
            local_d8 = "";
          }
          GetResourceStateString_abi_cxx11_
                    (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
          LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[3],std::__cxx11::string,char[14]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x96,(char (*) [29])"Description of render pass \'",&local_d8,
                     (char (*) [15])"\' is invalid: ",
                     (char (*) [37])"the final state of color attachment ",&PrsvAttachment,
                     (char (*) [3])0x5bee10,&msg,(char (*) [14])") is invalid.");
          goto LAB_004434ea;
        }
      }
    }
    RVar8 = PrsvAttachment + RESOURCE_STATE_UNDEFINED;
  } while( true );
}

Assistant:

void ValidateRenderPassDesc(const RenderPassDesc&      Desc,
                            const RenderDeviceInfo&    DeviceInfo,
                            const GraphicsAdapterInfo& AdapterInfo) noexcept(false)
{
#define LOG_RENDER_PASS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of render pass '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    const DeviceFeatures&        Features = DeviceInfo.Features;
    const ShadingRateProperties& SRProps  = AdapterInfo.ShadingRate;
    const bool                   IsVulkan = DeviceInfo.IsVulkanDevice();

    if (Desc.AttachmentCount != 0 && Desc.pAttachments == nullptr)
    {
        // If attachmentCount is not 0, pAttachments must be a valid pointer to an
        // array of attachmentCount valid VkAttachmentDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pAttachments-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the attachment count (", Desc.AttachmentCount, ") is not zero, but pAttachments is null.");
    }

    if (Desc.SubpassCount == 0)
    {
        // subpassCount must be greater than 0.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-subpassCount-arraylength
        LOG_RENDER_PASS_ERROR_AND_THROW("render pass must have at least one subpass.");
    }
    if (Desc.pSubpasses == nullptr)
    {
        // pSubpasses must be a valid pointer to an array of subpassCount valid VkSubpassDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pSubpasses-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("pSubpasses must not be null.");
    }

    if (Desc.DependencyCount != 0 && Desc.pDependencies == nullptr)
    {
        // If dependencyCount is not 0, pDependencies must be a valid pointer to an array of
        // dependencyCount valid VkSubpassDependency structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pDependencies-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the dependency count (", Desc.DependencyCount, ") is not zero, but pDependencies is null.");
    }

    for (Uint32 i = 0; i < Desc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attachment = Desc.pAttachments[i];
        if (Attachment.Format == TEX_FORMAT_UNKNOWN)
            LOG_RENDER_PASS_ERROR_AND_THROW("the format of attachment ", i, " is unknown.");

        if (Attachment.SampleCount == 0)
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count of attachment ", i, " is zero.");

        if (!IsPowerOfTwo(Attachment.SampleCount))
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count (", Uint32{Attachment.SampleCount}, ") of attachment ", i, " is not power of two.");

        const TextureFormatAttribs& FmtInfo = GetTextureFormatAttribs(Attachment.Format);
        if (FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH ||
            FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attachment.InitialState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.InitialState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.FinalState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
        else
        {
            if (Attachment.InitialState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_PRESENT &&
                Attachment.InitialState != RESOURCE_STATE_SHADING_RATE &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of color attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.FinalState != RESOURCE_STATE_PRESENT &&
                Attachment.FinalState != RESOURCE_STATE_SHADING_RATE &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of color attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
    }

    const ShadingRateAttachment* pShadingRateAttachment = nullptr;
    for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
    {
        const SubpassDesc& Subpass = Desc.pSubpasses[subpass];
        if (Subpass.InputAttachmentCount != 0 && Subpass.pInputAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the input attachment count (", Subpass.InputAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pInputAttachments is null.");
        }
        if (Subpass.RenderTargetAttachmentCount != 0 && Subpass.pRenderTargetAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the render target attachment count (", Subpass.RenderTargetAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pRenderTargetAttachments is null.");
        }
        if (Subpass.PreserveAttachmentCount != 0 && Subpass.pPreserveAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the preserve attachment count (", Subpass.PreserveAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pPreserveAttachments is null.");
        }

        for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pInputAttachments[input_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of input attachment reference ", input_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_INPUT_ATTACHMENT || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as input attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "INPUT_ATTACHMENT or COMMON" : "INPUT_ATTACHMENT"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }
        }

        for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of render target attachment reference ", rt_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_RENDER_TARGET || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "RENDER_TARGET or COMMON" : "RENDER_TARGET"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }

            const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " uses format ", FmtAttribs.Name, ", which is not a valid render target format.");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 rslv_attachment = 0; rslv_attachment < Subpass.RenderTargetAttachmentCount; ++rslv_attachment)
            {
                const AttachmentReference& AttchRef = Subpass.pResolveAttachments[rslv_attachment];
                if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                    continue;

                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of resolve attachment reference ", rslv_attachment,
                                                    " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }
            }
        }

        if (Subpass.pDepthStencilAttachment != nullptr)
        {
            const AttachmentReference& AttchRef = *Subpass.pDepthStencilAttachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of depth-stencil attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!(AttchRef.State == RESOURCE_STATE_DEPTH_READ || AttchRef.State == RESOURCE_STATE_DEPTH_WRITE || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth stencil attachment in subpass ", subpass,
                                                    " must be in ", (IsVulkan ? "DEPTH_READ, DEPTH_WRITE or COMMON" : "DEPTH_READ or DEPTH_WRITE"),
                                                    " state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
                const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
                if (FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH &&
                    FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth-stencil attachment in subpass ", subpass,
                                                    " uses format ", FmtAttribs.Name, ", which is not a valid depth buffer format.");
                }
            }
        }

        for (Uint32 prsv_attachment = 0; prsv_attachment < Subpass.PreserveAttachmentCount; ++prsv_attachment)
        {
            const Uint32 PrsvAttachment = Subpass.pPreserveAttachments[prsv_attachment];
            if (PrsvAttachment == ATTACHMENT_UNUSED)
            {
                // The attachment member of each element of pPreserveAttachments must not be VK_ATTACHMENT_UNUSED
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-attachment-00853
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " is ATTACHMENT_UNUSED.");
            }

            if (PrsvAttachment >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", PrsvAttachment, ") of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " exceeds the number of attachments (", Desc.AttachmentCount, ").");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 attchmnt = 0; attchmnt < Subpass.RenderTargetAttachmentCount; ++attchmnt)
            {
                const AttachmentReference& RTAttachmentRef   = Subpass.pRenderTargetAttachments[attchmnt];
                const AttachmentReference& RslvAttachmentRef = Subpass.pResolveAttachments[attchmnt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RTAttachmentRef.AttachmentIndex == ATTACHMENT_UNUSED)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not be VK_ATTACHMENT_UNUSED
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00847
                    LOG_RENDER_PASS_ERROR_AND_THROW("pResolveAttachments of subpass ", subpass, " is not null and resolve attachment reference ", attchmnt,
                                                    " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RTAttachmentRef.AttachmentIndex].SampleCount == 1)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00848
                    LOG_RENDER_PASS_ERROR_AND_THROW("Render target attachment at index ", RTAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " is used as the source of resolve operation, but its sample count is 1.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].SampleCount != 1)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED must
                    // have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00849
                    LOG_RENDER_PASS_ERROR_AND_THROW("Resolve attachment at index ", RslvAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " must have sample count of 1.");
                }

                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED &&
                    Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format != Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED
                    // must have the same VkFormat as its corresponding color attachment.
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00850
                    LOG_RENDER_PASS_ERROR_AND_THROW("The format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of render target attachment at index ", RTAttachmentRef.AttachmentIndex,
                                                    " referenced by attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " does not match the format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of the corresponding resolve attachment at index ",
                                                    RslvAttachmentRef.AttachmentIndex, ".");
                }
            }
        }

        if (Subpass.pShadingRateAttachment != nullptr)
        {
            pShadingRateAttachment              = pShadingRateAttachment != nullptr ? pShadingRateAttachment : Subpass.pShadingRateAttachment;
            const AttachmentReference& AttchRef = Subpass.pShadingRateAttachment->Attachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of shading rate attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!Features.VariableRateShading)
                    LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses a shading rate attachment, but VariableRateShading device feature is not enabled");

                if (AttchRef.State != RESOURCE_STATE_SHADING_RATE)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as shading rate attachment in subpass ", subpass,
                                                    " must be in SHADING_RATE state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const auto& TileSize = Subpass.pShadingRateAttachment->TileSize;
                if (TileSize[0] != 0 || TileSize[1] != 0)
                {
                    if (TileSize[0] < SRProps.MinTileSize[0] || TileSize[0] > SRProps.MaxTileSize[0])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[0], ", ", SRProps.MaxTileSize[0],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[1] < SRProps.MinTileSize[1] || TileSize[1] > SRProps.MaxTileSize[1])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile height ", TileSize[1],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[1], ", ", SRProps.MaxTileSize[1],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[0] != TileSize[1])
                    {
                        // The tile size is only used for Vulkan shading rate and current hardware only supports aspect ratio of 1.
                        // TODO: use VkPhysicalDeviceFragmentShadingRatePropertiesKHR::maxFragmentShadingRateAttachmentTexelSizeAspectRatio
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0], " that is not equal to the tile height ", TileSize[1], ".");
                    }
                    if (!IsPowerOfTwo(TileSize[0]) || !IsPowerOfTwo(TileSize[1]))
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile sizes ", TileSize[0], 'x', TileSize[1],
                                                        " that are not a powers of two.");
                    }
                }
            }
        }
    }

    if (pShadingRateAttachment != nullptr && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS) != SHADING_RATE_CAP_FLAG_NONE)
    {
        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& Subpass = Desc.pSubpasses[subpass];

            if (Subpass.pShadingRateAttachment == nullptr)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("render pass uses a shading rate attachment, but subpass ", subpass,
                                                " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS "
                                                "capability requires that all subpasses of a render pass use the same shading rate attachment.");
            }

            if (*Subpass.pShadingRateAttachment != *pShadingRateAttachment)
            {
                VERIFY_EXPR(subpass > 0);
                LOG_RENDER_PASS_ERROR_AND_THROW("shading rate attachment in subpass ", subpass,
                                                " does not match the shading rate attachment used by previous subpasses. "
                                                "A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability "
                                                "requires that all subpasses of a render pass use the same shading rate attachment.");
            }
        }
    }

    for (Uint32 i = 0; i < Desc.DependencyCount; ++i)
    {
        const SubpassDependencyDesc& Dependency = Desc.pDependencies[i];

        if (Dependency.SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the source stage mask of subpass dependency ", i, " is undefined.");
        }
        if (Dependency.DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the destination stage mask of subpass dependency ", i, " is undefined.");
        }
    }
}